

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O3

int Sbc_ManWlcNodes(Wlc_Ntk_t *pNtk,Gia_Man_t *p,Vec_Int_t *vGia2Out,int nOuts)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Wlc_Obj_t *pWVar5;
  bool bVar6;
  int iVar7;
  void *__ptr;
  char *pcVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong local_50;
  
  __ptr = malloc(400);
  if (1 < pNtk->iObj) {
    uVar14 = 1;
    local_50 = 100;
    do {
      if ((long)pNtk->nObjsAlloc <= (long)uVar14) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((long)(pNtk->vCopies).nSize <= (long)uVar14) {
LAB_00337f1b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pWVar5 = pNtk->pObjs;
      iVar7 = pWVar5[uVar14].End - pWVar5[uVar14].Beg;
      iVar10 = -iVar7;
      if (0 < iVar7) {
        iVar10 = iVar7;
      }
      uVar2 = (pNtk->vCopies).pArray[uVar14];
      uVar11 = 0;
      uVar9 = 0;
      do {
        if (((int)uVar2 < 0) || (lVar1 = uVar11 + uVar2, (pNtk->vBits).nSize <= (int)lVar1))
        goto LAB_00337f1b;
        uVar3 = (pNtk->vBits).pArray[lVar1];
        if ((int)uVar3 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (vGia2Out->nSize <= (int)(uVar3 >> 1)) goto LAB_00337f1b;
        uVar4 = vGia2Out->pArray[uVar3 >> 1];
        uVar13 = uVar9;
        if (uVar4 != 0xffffffff) {
          if ((int)uVar4 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pcVar8 = Wlc_ObjName(pNtk,(int)((long)pWVar5 + (uVar14 * 0x18 - (long)pNtk->pObjs) >> 3) *
                                    -0x55555555);
          uVar15 = uVar4 >> 1;
          printf("Matched node %5d (%10s) bit %3d (out of %3d) with output %3d(%d).\n",uVar14,pcVar8
                 ,uVar11 & 0xffffffff,(ulong)(iVar10 + 1),(ulong)uVar15,(uVar3 ^ uVar4) & 1);
          iVar12 = (int)uVar9;
          iVar7 = (int)local_50;
          if (iVar12 == iVar7) {
            if (iVar7 < 0x10) {
              if (__ptr == (void *)0x0) {
                __ptr = malloc(0x40);
              }
              else {
                __ptr = realloc(__ptr,0x40);
              }
              local_50 = 0x10;
            }
            else {
              local_50 = (ulong)(uint)(iVar7 * 2);
              if (__ptr == (void *)0x0) {
                __ptr = malloc(local_50 * 4);
              }
              else {
                __ptr = realloc(__ptr,local_50 * 4);
              }
            }
            if (__ptr == (void *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
          }
          if (0 < iVar12) {
            do {
              iVar7 = *(int *)((long)__ptr + uVar9 * 4 + -4);
              if (iVar7 <= (int)uVar15) goto LAB_00337e9a;
              *(int *)((long)__ptr + uVar9 * 4) = iVar7;
              bVar6 = 1 < uVar9;
              uVar9 = uVar9 - 1;
            } while (bVar6);
            uVar9 = 0;
          }
LAB_00337e9a:
          uVar13 = (ulong)(iVar12 + 1);
          *(uint *)((long)__ptr + (long)(int)uVar9 * 4) = uVar15;
        }
        uVar11 = uVar11 + 1;
        uVar9 = uVar13;
      } while (uVar11 != iVar10 + 1);
      if (0 < (int)uVar13) {
        putchar(10);
      }
      if ((int)uVar13 == nOuts) {
        iVar10 = (int)uVar14;
        printf("Found object %d with all bits matched.\n",uVar14 & 0xffffffff);
        goto LAB_00337efd;
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)pNtk->iObj);
  }
  iVar10 = -1;
LAB_00337efd:
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return iVar10;
}

Assistant:

int Sbc_ManWlcNodes( Wlc_Ntk_t * pNtk, Gia_Man_t * p, Vec_Int_t * vGia2Out, int nOuts )
{
    Wlc_Obj_t * pObj;  
    int i, k, iLitGia, iLitOut, iFirst, nBits, iObjFound = -1;
    Vec_Int_t * vMatched = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        iFirst = Vec_IntEntry( &pNtk->vCopies, i );
        nBits  = Wlc_ObjRange(pObj);
        Vec_IntClear( vMatched );
        for ( k = 0; k < nBits; k++ )
        {
            iLitGia = Vec_IntEntry( &pNtk->vBits, iFirst + k );
            iLitOut = Vec_IntEntry( vGia2Out, Abc_Lit2Var(iLitGia) );
            if ( iLitOut == -1 )
                continue;
            iLitOut = Abc_LitNotCond( iLitOut, Abc_LitIsCompl(iLitGia) );
            printf( "Matched node %5d (%10s) bit %3d (out of %3d) with output %3d(%d).\n", 
                i, Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), k, nBits, Abc_Lit2Var(iLitOut), Abc_LitIsCompl(iLitOut) );
            Vec_IntPushOrder( vMatched, Abc_Lit2Var(iLitOut) );
        }
        if ( Vec_IntSize(vMatched) > 0 )
            printf( "\n" );
        if ( Vec_IntSize(vMatched) == nOuts )
        {
            if ( iObjFound == -1 )
                iObjFound = i;
            printf( "Found object %d with all bits matched.\n", i );
            /*
            for ( k = nBits-2; k < nBits; k++ )
            {
                iLitGia = Vec_IntEntry( &pNtk->vBits, iFirst + k );
                {
                    word * pInfoObj = Wlc_ObjSim( p, Abc_Lit2Var(iLitGia) );
                    Extra_PrintHex( stdout, (unsigned *)pInfoObj, 6 ); printf( "\n" );
                }
            }
            */
            break;
        }
    }
    Vec_IntFree( vMatched );
    return iObjFound;
}